

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void * NULLC::AssertDerivedFrom(uint *derived,uint base)

{
  uint index;
  uint *puVar1;
  ExternTypeInfo *pEVar2;
  char *pcVar3;
  char *pcVar4;
  
  puVar1 = derived;
  if (derived != (uint *)0x0) {
    while (index = *puVar1, index != base) {
      pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),index);
      if (pEVar2->baseType == 0) {
        pcVar3 = nullcGetTypeName(*derived);
        pcVar4 = nullcGetTypeName(base);
        nullcThrowError("ERROR: cannot convert from \'%s\' to \'%s\'",pcVar3,pcVar4);
        return derived;
      }
      pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),index);
      puVar1 = &pEVar2->baseType;
    }
  }
  return derived;
}

Assistant:

void* NULLC::AssertDerivedFrom(unsigned* derived, unsigned base)
{
	if(!derived)
		return derived;

	unsigned typeId = *derived;

	for(;;)
	{
		if(base == typeId)
			return derived;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	nullcThrowError("ERROR: cannot convert from '%s' to '%s'", nullcGetTypeName(*derived), nullcGetTypeName(base));
	return derived;
}